

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_html.c
# Opt level: O3

int mpt_color_html(mpt_color *color,char *txt)

{
  long lVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  uint *puVar5;
  bool bVar6;
  uint8_t col [4];
  uint local_30;
  char local_2c;
  char local_2b;
  undefined1 local_2a;
  char cStack_29;
  
  local_30 = 0xff000000;
  if (txt == (char *)0x0) {
    piVar3 = __errno_location();
    *piVar3 = 0x16;
    iVar2 = -2;
  }
  else {
    local_2a = 0;
    cStack_29 = '\x03';
    puVar5 = &local_30;
    lVar1 = 1;
    do {
      lVar4 = lVar1;
      local_2c = txt[lVar4 + -1];
      if (local_2c == '\0') goto LAB_0010626b;
      local_2b = txt[lVar4];
      if (local_2b == '\0') {
        piVar3 = __errno_location();
        *piVar3 = 0x16;
        return -1;
      }
      iVar2 = mpt_cuint8(puVar5,&local_2c,0x10,0);
      if (iVar2 < 0) {
        return -1;
      }
      puVar5 = (uint *)((long)puVar5 + 1);
      bVar6 = cStack_29 != '\0';
      cStack_29 = cStack_29 + -1;
      lVar1 = lVar4 + 2;
    } while (bVar6);
    lVar4 = lVar4 + 1;
LAB_0010626b:
    iVar2 = (int)lVar4;
    if (color != (mpt_color *)0x0) {
      mpt_color_set(color,local_30 & 0xff,local_30 >> 8 & 0xff,local_30 >> 0x10 & 0xff);
      mpt_color_setalpha(color,local_30 >> 0x18);
    }
  }
  return iVar2;
}

Assistant:

extern int mpt_color_html(MPT_STRUCT(color) *color, const char *txt)
{
	uint8_t	col[4] = { 0, 0, 0, 255 };
	char	part[4];
	int	len, i = 0;
	
	if (!txt) {
		errno = EINVAL; return -2;
	}
	part[2] = '\0';
	part[3] = 4;
	len = 0;
	
	while (part[3]--) {
		if (!(part[0] = txt[len++]))
			break;
		
		if (!(part[1] = txt[len++])) {
			errno = EINVAL; return -1;
		}
		if (mpt_cuint8(&col[i++], part, 0x10, 0) < 0)
			return -1;
	}
	if (color) {
		mpt_color_set(color, col[0], col[1], col[2]);
		mpt_color_setalpha(color, col[3]);
	}
	return len;
}